

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O1

int32_t icu_63::RegexCImpl::split
                  (RegularExpression *regexp,UChar *destBuf,int32_t destCapacity,
                  int32_t *requiredCapacity,UChar **destFields,int32_t destFieldsCapacity,
                  UErrorCode *status)

{
  UChar *dest;
  RegexMatcher *this;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t groupNum;
  long lVar7;
  int iVar8;
  UErrorCode local_7c;
  int64_t local_78;
  int local_6c;
  UChar *local_68;
  UText *local_60;
  int local_54;
  UChar **local_50;
  long local_48;
  ulong local_40;
  int32_t *local_38;
  
  local_68 = destBuf;
  RegexMatcher::reset(regexp->fMatcher);
  this = regexp->fMatcher;
  lVar7 = this->fInputLength;
  if (lVar7 == 0) {
    iVar4 = 0;
  }
  else {
    local_60 = this->fInputText;
    local_38 = requiredCapacity;
    iVar2 = RegexMatcher::groupCount(this);
    local_7c = U_ZERO_ERROR;
    local_40 = (ulong)(uint)destFieldsCapacity;
    if (destFieldsCapacity < 2) {
      iVar6 = 0;
      iVar8 = 0;
      local_78 = 0;
      iVar4 = destFieldsCapacity + -1;
    }
    else {
      local_54 = destFieldsCapacity + -2;
      local_78 = 0;
      iVar8 = 0;
      iVar6 = 0;
      local_6c = destFieldsCapacity + -1;
      local_50 = destFields;
      local_48 = lVar7;
      do {
        destFields = local_50;
        UVar1 = RegexMatcher::find(regexp->fMatcher);
        dest = local_68 + iVar8;
        destFields[iVar6] = dest;
        if (UVar1 == '\0') {
          iVar2 = 0;
          if (0 < destCapacity - iVar8) {
            iVar2 = destCapacity - iVar8;
          }
          iVar2 = utext_extract_63(local_60,local_78,local_48,dest,iVar2,status);
          iVar8 = iVar8 + iVar2 + 1;
          goto LAB_0015d536;
        }
        iVar3 = destCapacity - iVar8;
        if (destCapacity - iVar8 < 1) {
          iVar3 = 0;
        }
        iVar3 = utext_extract_63(local_60,local_78,regexp->fMatcher->fMatchStart,dest,iVar3,
                                 &local_7c);
        if (local_7c == U_BUFFER_OVERFLOW_ERROR) {
          local_7c = U_ZERO_ERROR;
        }
        else {
          *status = local_7c;
        }
        iVar8 = iVar8 + iVar3 + 1;
        local_78 = regexp->fMatcher->fMatchEnd;
        iVar4 = iVar6;
        if (iVar6 != local_6c && 0 < iVar2) {
          lVar7 = 1;
          iVar5 = iVar6;
          do {
            destFields[iVar6 + lVar7] = local_68 + iVar8;
            local_7c = U_ZERO_ERROR;
            iVar3 = destCapacity - iVar8;
            if (destCapacity - iVar8 < 1) {
              iVar3 = 0;
            }
            groupNum = (int32_t)lVar7;
            iVar3 = uregex_group_63((URegularExpression *)regexp,groupNum,local_68 + iVar8,iVar3,
                                    &local_7c);
            if (local_7c == U_BUFFER_OVERFLOW_ERROR) {
              local_7c = U_ZERO_ERROR;
            }
            else {
              *status = local_7c;
            }
            iVar8 = iVar8 + iVar3 + 1;
            iVar4 = iVar5 + 1;
          } while ((local_54 != iVar5) && (lVar7 = lVar7 + 1, iVar5 = iVar4, groupNum < iVar2));
        }
        iVar6 = iVar4;
        if (local_78 == local_48) {
          if (iVar8 < destCapacity) {
            local_68[iVar8] = L'\0';
          }
          iVar6 = (uint)(iVar6 < local_6c) + iVar6;
          if (iVar8 < destCapacity) {
            local_50[iVar6] = local_68 + iVar8;
          }
          iVar8 = iVar8 + 1;
        }
        destFields = local_50;
        if (local_78 == local_48) goto LAB_0015d536;
        iVar6 = iVar6 + 1;
        lVar7 = local_48;
        iVar4 = local_6c;
      } while (iVar6 < local_6c);
    }
    if (local_78 < lVar7) {
      if (iVar6 != iVar4) {
        iVar8 = (int)((ulong)((long)destFields[iVar4] - (long)*destFields) >> 1);
        iVar6 = iVar4;
      }
      destFields[iVar6] = local_68 + iVar8;
      iVar2 = 0;
      if (0 < destCapacity - iVar8) {
        iVar2 = destCapacity - iVar8;
      }
      iVar2 = utext_extract_63(local_60,local_78,lVar7,local_68 + iVar8,iVar2,status);
      iVar8 = iVar8 + iVar2 + 1;
    }
LAB_0015d536:
    iVar4 = iVar6 + 1;
    if (iVar4 < (int)local_40) {
      memset(destFields + (long)iVar6 + 1,0,(ulong)(((int)local_40 - iVar6) - 2) * 8 + 8);
    }
    if (local_38 != (int32_t *)0x0) {
      *local_38 = iVar8;
    }
    if (destCapacity < iVar8) {
      *status = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return iVar4;
}

Assistant:

int32_t RegexCImpl::split(RegularExpression     *regexp,
                          UChar                 *destBuf,
                          int32_t                destCapacity,
                          int32_t               *requiredCapacity,
                          UChar                 *destFields[],
                          int32_t                destFieldsCapacity,
                          UErrorCode            *status) {
    //
    // Reset for the input text
    //
    regexp->fMatcher->reset();
    UText *inputText = regexp->fMatcher->fInputText;
    int64_t   nextOutputStringStart = 0;
    int64_t   inputLen = regexp->fMatcher->fInputLength;
    if (inputLen == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t   i;             // Index of the field being processed.
    int32_t   destIdx = 0;   // Next available position in destBuf;
    int32_t   numCaptureGroups = regexp->fMatcher->groupCount();
    UErrorCode  tStatus = U_ZERO_ERROR;   // Want to ignore any buffer overflow errors so that the strings are still counted
    for (i=0; ; i++) {
        if (i>=destFieldsCapacity-1) {
            // There are one or zero output strings left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destFieldsCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            if (inputLen > nextOutputStringStart) {
                if (i != destFieldsCapacity-1) {
                    // No fields are left.  Recycle the last one for holding the trailing part of
                    //   the input string.
                    i = destFieldsCapacity-1;
                    destIdx = (int32_t)(destFields[i] - destFields[0]);
                }

                destFields[i] = &destBuf[destIdx];
                destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                             &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            }
            break;
        }

        if (regexp->fMatcher->find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            destFields[i] = &destBuf[destIdx];

            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, regexp->fMatcher->fMatchStart,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), &tStatus);
            if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                tStatus = U_ZERO_ERROR;
            } else {
                *status = tStatus;
            }
            nextOutputStringStart = regexp->fMatcher->fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                // If we've run out of output string slots, bail out.
                if (i==destFieldsCapacity-1) {
                    break;
                }
                i++;

                // Set up to extract the capture group contents into the dest buffer.
                destFields[i] = &destBuf[destIdx];
                tStatus = U_ZERO_ERROR;
                int32_t t = uregex_group((URegularExpression*)regexp,
                                         groupNum,
                                         destFields[i],
                                         REMAINING_CAPACITY(destIdx, destCapacity),
                                         &tStatus);
                destIdx += t + 1;    // Record the space used in the output string buffer.
                                     //  +1 for the NUL that terminates the string.
                if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                    tStatus = U_ZERO_ERROR;
                } else {
                    *status = tStatus;
                }
            }

            if (nextOutputStringStart == inputLen) {
                // The delimiter was at the end of the string.
                // Output an empty string, and then we are done.
                if (destIdx < destCapacity) {
                    destBuf[destIdx] = 0;
                }
                if (i < destFieldsCapacity-1) {
                   ++i;
                }
                if (destIdx < destCapacity) {
                    destFields[i] = destBuf + destIdx;
                }
                ++destIdx;
                break;
            }

        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            destFields[i] = &destBuf[destIdx];
            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            break;
        }
    }

    // Zero out any unused portion of the destFields array
    int j;
    for (j=i+1; j<destFieldsCapacity; j++) {
        destFields[j] = NULL;
    }

    if (requiredCapacity != NULL) {
        *requiredCapacity = destIdx;
    }
    if (destIdx > destCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }
    return i+1;
}